

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPrimitiveRestartTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Functional::PrimitiveRestartCase::iterate(PrimitiveRestartCase *this)

{
  int iVar1;
  int iVar2;
  RenderContext *pRVar3;
  int width;
  bool bVar4;
  deUint32 dVar5;
  GLuint GVar6;
  RenderTarget *pRVar7;
  char *description;
  uint y;
  uint x;
  int height;
  Surface resultImg;
  Surface referenceImg;
  Random rnd;
  TextureFormat local_a0;
  Surface local_98;
  Surface local_80;
  PixelBufferAccess local_68;
  deRandom local_40;
  
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  width = pRVar7->m_width;
  if (0xff < pRVar7->m_width) {
    width = 0x100;
  }
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  height = 0x100;
  if (pRVar7->m_height < 0x100) {
    height = pRVar7->m_height;
  }
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar1 = pRVar7->m_width;
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar2 = pRVar7->m_height;
  dVar5 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init(&local_40,dVar5);
  dVar5 = deRandom_getUint32(&local_40);
  x = dVar5 % ((iVar1 - width) + 1U);
  dVar5 = deRandom_getUint32(&local_40);
  y = dVar5 % ((iVar2 - height) + 1U);
  tcu::Surface::Surface(&local_80,width,height);
  tcu::Surface::Surface(&local_98,width,height);
  glwViewport(x,y,width,height);
  glwClearColor(0.0,0.0,0.0,1.0);
  GVar6 = (this->m_program->m_program).m_program;
  glwUseProgram(GVar6);
  GVar6 = glwGetAttribLocation(GVar6,"a_position");
  glwEnableVertexAttribArray(GVar6);
  glwVertexAttribPointer
            (GVar6,2,0x1406,'\0',0,
             (this->m_positions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start);
  renderWithRestart(this);
  pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_a0.order = RGBA;
  local_a0.type = UNORM_INT8;
  if ((void *)local_98.m_pixels.m_cap != (void *)0x0) {
    local_98.m_pixels.m_cap = (size_t)local_98.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_68,&local_a0,local_98.m_width,local_98.m_height,1,
             (void *)local_98.m_pixels.m_cap);
  glu::readPixels(pRVar3,x,y,&local_68);
  renderWithoutRestart(this);
  pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_a0.order = RGBA;
  local_a0.type = UNORM_INT8;
  if ((void *)local_80.m_pixels.m_cap != (void *)0x0) {
    local_80.m_pixels.m_cap = (size_t)local_80.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_68,&local_a0,local_80.m_width,local_80.m_height,1,
             (void *)local_80.m_pixels.m_cap);
  glu::readPixels(pRVar3,x,y,&local_68);
  local_68.super_ConstPixelBufferAccess.m_format.order = R;
  bVar4 = tcu::pixelThresholdCompare
                    (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                     "ComparisonResult","Image comparison result",&local_80,&local_98,
                     (RGBA *)&local_68,COMPARE_LOG_RESULT);
  description = "Fail";
  if (bVar4) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar4,description
            );
  glwUseProgram(0);
  tcu::Surface::~Surface(&local_98);
  tcu::Surface::~Surface(&local_80);
  return STOP;
}

Assistant:

PrimitiveRestartCase::IterateResult PrimitiveRestartCase::iterate (void)
{
	int							width			= deMin32(m_context.getRenderTarget().getWidth(), MAX_RENDER_WIDTH);
	int							height			= deMin32(m_context.getRenderTarget().getHeight(), MAX_RENDER_HEIGHT);

	int							xOffsetMax		= m_context.getRenderTarget().getWidth() - width;
	int							yOffsetMax		= m_context.getRenderTarget().getHeight() - height;

	de::Random					rnd				(deStringHash(getName()));

	int							xOffset			= rnd.getInt(0, xOffsetMax);
	int							yOffset			= rnd.getInt(0, yOffsetMax);
	tcu::Surface				referenceImg	(width, height);
	tcu::Surface				resultImg		(width, height);

	glViewport(xOffset, yOffset, width, height);
	glClearColor(0.0f, 0.0f, 0.0f, 1.0f);

	deUint32 program = m_program->getProgram();
	glUseProgram(program);

	// Setup position attribute.

	int loc = glGetAttribLocation(program, "a_position");
	glEnableVertexAttribArray(loc);
	glVertexAttribPointer(loc, 2, GL_FLOAT, GL_FALSE, 0, &m_positions[0]);

	// Render result.

	renderWithRestart();
	glu::readPixels(m_context.getRenderContext(), xOffset, yOffset, resultImg.getAccess());

	// Render reference (same scene as the real deal, but emulate primitive restart without actually using it).

	renderWithoutRestart();
	glu::readPixels(m_context.getRenderContext(), xOffset, yOffset, referenceImg.getAccess());

	// Compare.

	bool testOk = tcu::pixelThresholdCompare(m_testCtx.getLog(), "ComparisonResult", "Image comparison result", referenceImg, resultImg, tcu::RGBA(0, 0, 0, 0), tcu::COMPARE_LOG_RESULT);

	m_testCtx.setTestResult(testOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							testOk ? "Pass"					: "Fail");

	glUseProgram(0);

	return STOP;
}